

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSetContentLength(UpnpClient_Handle Hnd,size_t contentLength)

{
  Upnp_Handle_Type UVar1;
  Handle_Info *local_28;
  Handle_Info *HInfo;
  size_t sStack_18;
  int errCode;
  size_t contentLength_local;
  UpnpClient_Handle Hnd_local;
  
  HInfo._4_4_ = 0;
  local_28 = (Handle_Info *)0x0;
  sStack_18 = contentLength;
  contentLength_local._0_4_ = Hnd;
  if (UpnpSdkInit == 1) {
    HandleLock(".upnp/src/api/upnpapi.c",0x1212);
    UVar1 = GetHandleInfo((UpnpClient_Handle)contentLength_local,&local_28);
    if (UVar1 != HND_DEVICE) {
      HandleUnlock(".upnp/src/api/upnpapi.c",0x1218);
      return -100;
    }
    if (sStack_18 < 0x7d01) {
      g_maxContentLength = sStack_18;
    }
    else {
      HInfo._4_4_ = -0x1fa;
    }
  }
  else {
    HInfo._4_4_ = -0x74;
  }
  HandleUnlock(".upnp/src/api/upnpapi.c",0x1222);
  return HInfo._4_4_;
}

Assistant:

int UpnpSetContentLength(UpnpClient_Handle Hnd, size_t contentLength)
{
	int errCode = UPNP_E_SUCCESS;
	struct Handle_Info *HInfo = NULL;

	do {
		if (UpnpSdkInit != 1) {
			errCode = UPNP_E_FINISH;
			break;
		}

		HandleLock(__FILE__, __LINE__);

		switch (GetHandleInfo(Hnd, &HInfo)) {
		case HND_DEVICE:
			break;
		default:
			HandleUnlock(__FILE__, __LINE__);
			return UPNP_E_INVALID_HANDLE;
		}
		if (contentLength > MAX_SOAP_CONTENT_LENGTH) {
			errCode = UPNP_E_OUTOF_BOUNDS;
			break;
		}
		g_maxContentLength = contentLength;
	} while (0);

	HandleUnlock(__FILE__, __LINE__);
	return errCode;
}